

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  FileDescriptor *file_00;
  int i;
  long lVar1;
  FileDescriptor *local_40;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_38;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
  local_30;
  
  if (file != (FileDescriptor *)0x0) {
    local_38 = &this->dependencies_;
    local_40 = file;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::EmplaceDecomposable::operator()(&local_30,&local_38,&local_40,&local_40);
    if ((local_40 != (FileDescriptor *)0x0 & local_30.second) == 1) {
      lVar1 = 0;
      do {
        if (local_40->public_dependency_count_ <= lVar1) {
          return;
        }
        file_00 = FileDescriptor::dependency(local_40,local_40->public_dependencies_[lVar1]);
        RecordPublicDependencies(this,file_00);
        lVar1 = lVar1 + 1;
      } while (local_40 != (FileDescriptor *)0x0);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == nullptr || !dependencies_.insert(file).second) return;
  for (int i = 0; file != nullptr && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}